

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_4> * __thiscall
tcu::refract<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *i,
          Vector<double,_4> *n,double eta)

{
  int i_1;
  long lVar1;
  Vector<double,_4> *res_3;
  double dVar2;
  double res;
  double dVar3;
  Vector<double,_4> res_2;
  Vector<double,_4> res_1;
  double local_58 [9];
  
  dVar3 = 0.0;
  lVar1 = 0;
  do {
    dVar3 = dVar3 + i->m_data[lVar1] * *(double *)(this + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar3 * dVar3);
  if (0.0 <= dVar2) {
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[4] = 0.0;
    local_58[5] = 0.0;
    lVar1 = 0;
    do {
      local_58[lVar1 + 4] = *(double *)(this + lVar1 * 8) * eta;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    lVar1 = 0;
    do {
      local_58[lVar1] = i->m_data[lVar1] * (eta * dVar3 + dVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    lVar1 = 0;
    do {
      __return_storage_ptr__->m_data[lVar1] = local_58[lVar1 + 4] - local_58[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}